

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_221797::ConstPubkeyProvider::ToNormalizedString
          (ConstPubkeyProvider *this,SigningProvider *arg,string *ret,DescriptorCache *cache)

{
  long in_FS_OFFSET;
  string sStack_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (anonymous_namespace)::ConstPubkeyProvider::ToString_abi_cxx11_(&sStack_38,this,(StringType)ret);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (ret,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool ToNormalizedString(const SigningProvider& arg, std::string& ret, const DescriptorCache* cache) const override
    {
        ret = ToString(StringType::PUBLIC);
        return true;
    }